

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O1

uint tinf_adler32(void *data,uint length)

{
  uint uVar1;
  long lVar2;
  uchar *buf;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar13;
  
  if (length != 0) {
    uVar11 = 1;
    uVar1 = 0;
    do {
      uVar3 = 0x15b0;
      if (length < 0x15b0) {
        uVar3 = (ulong)length;
      }
      if (0xf < length) {
        uVar13 = uVar3 >> 4;
        do {
          iVar14 = *data + uVar11;
          iVar4 = (uint)*(byte *)((long)data + 1) + iVar14;
          iVar15 = (uint)*(byte *)((long)data + 2) + iVar4;
          iVar5 = (uint)*(byte *)((long)data + 3) + iVar15;
          iVar16 = (uint)*(byte *)((long)data + 4) + iVar5;
          iVar6 = (uint)*(byte *)((long)data + 5) + iVar16;
          iVar17 = (uint)*(byte *)((long)data + 6) + iVar6;
          iVar7 = (uint)*(byte *)((long)data + 7) + iVar17;
          iVar18 = (uint)*(byte *)((long)data + 8) + iVar7;
          iVar8 = (uint)*(byte *)((long)data + 9) + iVar18;
          iVar19 = (uint)*(byte *)((long)data + 10) + iVar8;
          iVar9 = (uint)*(byte *)((long)data + 0xb) + iVar19;
          iVar20 = (uint)*(byte *)((long)data + 0xc) + iVar9;
          iVar10 = (uint)*(byte *)((long)data + 0xd) + iVar20;
          iVar21 = (uint)*(byte *)((long)data + 0xe) + iVar10;
          uVar11 = (uint)*(byte *)((long)data + 0xf) + iVar21;
          uVar1 = uVar1 + iVar14 + iVar4 + iVar15 + iVar5 + iVar16 + iVar6 + iVar17 + iVar7 + iVar18
                  + iVar8 + iVar19 + iVar9 + iVar20 + iVar10 + iVar21 + uVar11;
          data = (void *)((long)data + 0x10);
          uVar12 = (int)uVar13 - 1;
          uVar13 = (ulong)uVar12;
        } while (uVar12 != 0);
      }
      uVar12 = (uint)uVar3 & 0xf;
      if ((uVar3 & 0xf) != 0) {
        lVar2 = 0;
        do {
          uVar11 = uVar11 + *(byte *)((long)data + lVar2);
          uVar1 = uVar1 + uVar11;
          lVar2 = lVar2 + 1;
        } while (uVar12 != (uint)lVar2);
        data = (void *)((long)data + (ulong)(uVar12 - 1) + 1);
      }
      uVar11 = uVar11 % 0xfff1;
      uVar1 = uVar1 % 0xfff1;
      length = length - (uint)uVar3;
    } while (length != 0);
    return uVar1 * 0x10000 | uVar11;
  }
  return 1;
}

Assistant:

unsigned int tinf_adler32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;

	unsigned int s1 = 1;
	unsigned int s2 = 0;

	while (length > 0) {
		int k = length < A32_NMAX ? length : A32_NMAX;
		int i;

		for (i = k / 16; i; --i, buf += 16) {
			s1 += buf[0];
			s2 += s1;
			s1 += buf[1];
			s2 += s1;
			s1 += buf[2];
			s2 += s1;
			s1 += buf[3];
			s2 += s1;
			s1 += buf[4];
			s2 += s1;
			s1 += buf[5];
			s2 += s1;
			s1 += buf[6];
			s2 += s1;
			s1 += buf[7];
			s2 += s1;

			s1 += buf[8];
			s2 += s1;
			s1 += buf[9];
			s2 += s1;
			s1 += buf[10];
			s2 += s1;
			s1 += buf[11];
			s2 += s1;
			s1 += buf[12];
			s2 += s1;
			s1 += buf[13];
			s2 += s1;
			s1 += buf[14];
			s2 += s1;
			s1 += buf[15];
			s2 += s1;
		}

		for (i = k % 16; i; --i) {
			s1 += *buf++;
			s2 += s1;
		}

		s1 %= A32_BASE;
		s2 %= A32_BASE;

		length -= k;
	}

	return (s2 << 16) | s1;
}